

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gabor.h
# Opt level: O3

void __thiscall gimage::GaborKernel::set(GaborKernel *this,float s,float l,float t,float g,float p)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  float *pfVar4;
  ulong uVar5;
  long lVar6;
  long i;
  long lVar7;
  long lVar8;
  long lVar9;
  float *pfVar10;
  float fVar11;
  float fVar12;
  double dVar13;
  double dVar14;
  float fVar15;
  float fVar16;
  double dVar17;
  double dVar18;
  
  if (s <= 0.5) {
    s = 0.5;
  }
  lVar9 = (long)(int)((int)(s * 5.0 + 0.5) | 1);
  Image<float,_gimage::PixelTraits<float>_>::setSize(&this->re,lVar9,lVar9,1);
  Image<float,_gimage::PixelTraits<float>_>::setSize(&this->im,lVar9,lVar9,1);
  uVar1 = (this->re).height;
  if (0 < (long)uVar1) {
    pfVar4 = **(this->im).img;
    uVar5 = (this->re).width;
    pfVar10 = **(this->re).img;
    lVar6 = (long)(int)(uVar5 >> 1);
    uVar2 = uVar1 >> 1;
    fVar15 = 0.0;
    fVar16 = 0.0;
    lVar9 = 0;
    do {
      if (0 < (long)uVar5) {
        dVar18 = (double)(lVar9 - (int)uVar2);
        lVar7 = 0;
        lVar3 = 0;
        lVar8 = lVar6;
        do {
          fVar11 = sinf(t);
          fVar12 = cosf(t);
          dVar17 = (double)(lVar3 - lVar6) * (double)fVar12 + dVar18 * (double)fVar11;
          dVar13 = (double)lVar8 * (double)fVar11 + (double)fVar12 * dVar18;
          dVar13 = exp(-(dVar17 * dVar17 + dVar13 * (double)(g * g) * dVar13) /
                       (double)((s + s) * s));
          dVar17 = (dVar17 * 6.283185307179586) / (double)l + (double)p;
          dVar14 = cos(dVar17);
          pfVar10[lVar3] = (float)(dVar14 * dVar13);
          dVar17 = sin(dVar17);
          pfVar4[lVar3] = (float)(dVar17 * dVar13);
          fVar15 = fVar15 + ABS((float)(dVar17 * dVar13));
          fVar16 = fVar16 + ABS(pfVar10[lVar3]);
          lVar3 = lVar3 + 1;
          uVar5 = (this->re).width;
          lVar7 = lVar7 + -4;
          lVar8 = lVar8 + -1;
        } while (lVar3 < (long)uVar5);
        uVar1 = (this->re).height;
        pfVar10 = (float *)((long)pfVar10 - lVar7);
        pfVar4 = (float *)((long)pfVar4 - lVar7);
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < (long)uVar1);
    if (0 < (long)uVar1) {
      pfVar4 = **(this->im).img;
      lVar9 = (this->re).width;
      pfVar10 = **(this->re).img;
      uVar5 = 0;
      do {
        if (0 < lVar9) {
          lVar6 = 0;
          lVar8 = 0;
          do {
            pfVar10[lVar8] = pfVar10[lVar8] / fVar16;
            pfVar4[lVar8] = pfVar4[lVar8] / fVar15;
            lVar8 = lVar8 + 1;
            lVar6 = lVar6 + -4;
          } while (lVar9 != lVar8);
          pfVar10 = (float *)((long)pfVar10 - lVar6);
          pfVar4 = (float *)((long)pfVar4 - lVar6);
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 != uVar1);
    }
  }
  return;
}

Assistant:

void set(float s, float l, float t, float g=1, float p=0)
    {
      s=std::max(0.5f, s);

      int kn=static_cast<int>(5*s+0.5f);

      if ((kn&1) == 0)
      {
        kn++;
      }

      re.setSize(kn, kn, 1);
      im.setSize(kn, kn, 1);

      int w2=re.getWidth()>>1;
      int h2=re.getHeight()>>1;

      // compute kernels for real and imaginary part

      float re_sum=0;
      float im_sum=0;

      float *rep=re.getPtr(0, 0, 0);
      float *imp=im.getPtr(0, 0, 0);

      for (long k=0; k<re.getHeight(); k++)
      {
        for (long i=0; i<re.getWidth(); i++)
        {
          double st=std::sin(t);
          double ct=std::cos(t);

          double a=(i-w2)*ct+(k-h2)*st;
          double b=-(i-w2)*st+(k-h2)*ct;

          double gs=std::exp(-(a*a+g*g*b*b)/(2*s*s));

          a=2*gmath::pi*a/l+p;

          *rep=static_cast<float>(gs*std::cos(a));
          *imp=static_cast<float>(gs*std::sin(a));

          re_sum+=std::abs(*rep++);
          im_sum+=std::abs(*imp++);
        }
      }

      // normalization of kernal to absolute sum of 1

      rep=re.getPtr(0, 0, 0);
      imp=im.getPtr(0, 0, 0);

      for (long k=0; k<re.getHeight(); k++)
      {
        for (long i=0; i<re.getWidth(); i++)
        {
          *rep++/=re_sum;
          *imp++/=im_sum;
        }
      }
    }